

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O2

int __thiscall
gmlc::networking::TcpAcceptor::connect(TcpAcceptor *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *this_00;
  bool bVar1;
  socklen_t __len_00;
  int iVar2;
  undefined8 unaff_RBX;
  allocator<char> local_8d;
  AcceptingStates exp;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  exp = OPENED;
  this_00 = &this->state;
  __len_00 = 5;
  bVar1 = std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::compare_exchange_strong
                    (this_00,&exp,CONNECTING,seq_cst);
  if (bVar1) {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::bind
              (&this->acceptor_,(int)this + 0x10,(sockaddr *)&ec,__len_00);
    iVar2 = (int)CONCAT71((int7)((ulong)&ec >> 8),ec._M_value == 0);
    if (ec._M_value == 0) {
      LOCK();
      this_00->_M_i = CONNECTED;
      UNLOCK();
    }
    else {
      LOCK();
      this_00->_M_i = OPENED;
      UNLOCK();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"acceptor error",&local_8d);
      (**(code **)(*(long *)ec._M_cat + 0x20))(&local_78,ec._M_cat,ec._M_value);
      std::operator+(&local_38,&local_58,&local_78);
      logger(this,0,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  else {
    iVar2 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),this_00->_M_i == CONNECTED);
  }
  return iVar2;
}

Assistant:

bool TcpAcceptor::connect()
{
    AcceptingStates exp = AcceptingStates::OPENED;
    if (state.compare_exchange_strong(exp, AcceptingStates::CONNECTING)) {
        std::error_code ec;
        acceptor_.bind(endpoint_, ec);
        if (ec) {
            state = AcceptingStates::OPENED;
            logger(0, std::string("acceptor error") + ec.message());
            return false;
        }
        state = AcceptingStates::CONNECTED;
        return true;
    }
    return (state == AcceptingStates::CONNECTED);
}